

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

void __thiscall phosg::RedBoldTerminalGuard::~RedBoldTerminalGuard(RedBoldTerminalGuard *this)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  string e;
  unsigned_long local_38;
  pointer local_30;
  string local_28;
  
  if (this->active == true) {
    format_color_escape_abi_cxx11_(&local_28,NORMAL,0xffffffff);
    local_30 = local_28._M_dataplus._M_p;
    local_38 = local_28._M_string_length;
    if ((this->write_data).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = ::std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    (*(this->write_data)._M_invoker)((_Any_data *)this,&local_30,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var1 = (this->write_data).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

~RedBoldTerminalGuard() {
    if (this->active) {
      string e = format_color_escape(TerminalFormat::NORMAL, TerminalFormat::END);
      this->write_data(e.data(), e.size());
    }
  }